

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

void __thiscall seq_precede_inc::~seq_precede_inc(seq_precede_inc *this)

{
  Propagator *in_RDI;
  
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_0031cbb8;
  vec<int>::~vec((vec<int> *)in_RDI);
  vec<int>::~vec((vec<int> *)in_RDI);
  vec<Tint>::~vec((vec<Tint> *)in_RDI);
  vec<Tint>::~vec((vec<Tint> *)in_RDI);
  vec<Tint>::~vec((vec<Tint> *)in_RDI);
  vec<Tint>::~vec((vec<Tint> *)in_RDI);
  vec<IntVar_*>::~vec((vec<IntVar_*> *)in_RDI);
  Propagator::~Propagator(in_RDI);
  return;
}

Assistant:

Clause* ex_ub(int xi, int k) {
		Clause* r = Reason_new(xi + 1);

		// One of the predecessors must be (at least) k.
		for (int ii = 0; ii < xi; ++ii) {
			(*r)[ii + 1] = xs[ii]->getLit(k, LR_GE);
		}
		return r;
	}